

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

CURLcode Curl_pollfds_add_ps(curl_pollfds *cpfds,easy_pollset *ps)

{
  short events;
  uint uVar1;
  CURLcode CVar2;
  ulong uVar3;
  
  uVar1 = ps->num;
  if (uVar1 == 0) {
    return CURLE_OK;
  }
  uVar3 = 0;
  do {
    events = (ps->actions[uVar3] & 1) + (ps->actions[uVar3] & 2) * 2;
    if ((char)events != '\0') {
      CVar2 = cpfds_add_sock(cpfds,ps->sockets[uVar3],events,true);
      if (CVar2 != CURLE_OK) {
        return CURLE_OUT_OF_MEMORY;
      }
      uVar1 = ps->num;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 < uVar1);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_pollfds_add_ps(struct curl_pollfds *cpfds,
                             struct easy_pollset *ps)
{
  size_t i;

  DEBUGASSERT(cpfds);
  DEBUGASSERT(ps);
  for(i = 0; i < ps->num; i++) {
    short events = 0;
    if(ps->actions[i] & CURL_POLL_IN)
      events |= POLLIN;
    if(ps->actions[i] & CURL_POLL_OUT)
      events |= POLLOUT;
    if(events) {
      if(cpfds_add_sock(cpfds, ps->sockets[i], events, TRUE))
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}